

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O0

void __thiscall
CGL::SceneObjects::DirectionalLight::DirectionalLight
          (DirectionalLight *this,Vector3D *rad,Vector3D *posLight,Vector3D *lightDir)

{
  Vector3D *in_RSI;
  SceneLight *in_RDI;
  Vector3D *in_stack_ffffffffffffff78;
  _func_int **local_68;
  _func_int **local_60;
  _func_int **local_58;
  _func_int **local_50;
  _func_int **local_48;
  _func_int **local_40;
  _func_int **local_38;
  _func_int **local_30;
  
  SceneLight::SceneLight(in_RDI);
  in_RDI->_vptr_SceneLight = (_func_int **)&PTR_sample_L_001408f0;
  Vector3D::Vector3D((Vector3D *)(in_RDI + 2));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 6));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 10),in_RSI);
  Vector3D::operator-(in_RSI);
  in_RDI[6]._vptr_SceneLight = local_48;
  in_RDI[7]._vptr_SceneLight = local_40;
  in_RDI[8]._vptr_SceneLight = local_38;
  in_RDI[9]._vptr_SceneLight = local_30;
  Vector3D::unit(in_stack_ffffffffffffff78);
  Vector3D::operator-(in_RSI);
  in_RDI[2]._vptr_SceneLight = local_68;
  in_RDI[3]._vptr_SceneLight = local_60;
  in_RDI[4]._vptr_SceneLight = local_58;
  in_RDI[5]._vptr_SceneLight = local_50;
  return;
}

Assistant:

DirectionalLight::DirectionalLight(const Vector3D rad,const Vector3D posLight,
                                   const Vector3D lightDir)
    : radiance(rad) {
  this->posLight = -posLight;
  dirToLight = -lightDir.unit();
}